

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringCompareMethod::StringCompareMethod
          (StringCompareMethod *this,Builtins *builtins,KnownSystemName knownNameId,bool ignoreCase)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_51;
  Type *local_50;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_48;
  
  local_50 = &(builtins->stringType).super_Type;
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_48,__l,&local_51);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,knownNameId,Function,1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_48,(Type *)&builtins->intType,true,false);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_48);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005b27c0;
  (this->super_SimpleSystemSubroutine).field_0x62 = ignoreCase;
  return;
}

Assistant:

StringCompareMethod(const Builtins& builtins, KnownSystemName knownNameId, bool ignoreCase) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 1, {&builtins.stringType},
                               builtins.intType, true),
        ignoreCase(ignoreCase) {}